

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brake.cpp
# Opt level: O0

void __thiscall
ruckig::BrakeProfile::acceleration_brake
          (BrakeProfile *this,double v0,double a0,double vMax,double vMin,double aMax,double aMin,
          double jMax)

{
  reference pvVar1;
  double *pdVar2;
  double dVar3;
  double local_88;
  double local_80;
  double local_78;
  double t_to_v_max;
  double t_to_v_min;
  double v_at_a_zero;
  double v_at_a_max;
  double t_to_a_zero;
  double t_to_a_max;
  double jMax_local;
  double aMin_local;
  double aMax_local;
  double vMin_local;
  double vMax_local;
  double a0_local;
  double v0_local;
  BrakeProfile *this_local;
  
  t_to_a_max = jMax;
  jMax_local = aMin;
  aMin_local = aMax;
  aMax_local = vMin;
  vMin_local = vMax;
  vMax_local = a0;
  a0_local = v0;
  v0_local = (double)this;
  pvVar1 = std::array<double,_2UL>::operator[](&this->j,0);
  *pvVar1 = -jMax;
  t_to_a_zero = (vMax_local - aMin_local) / t_to_a_max;
  v_at_a_max = vMax_local / t_to_a_max;
  v_at_a_zero = v_at_t(a0_local,vMax_local,-t_to_a_max,t_to_a_zero);
  t_to_v_min = v_at_t(a0_local,vMax_local,-t_to_a_max,v_at_a_max);
  if (((vMin_local < t_to_v_min) && (0.0 < t_to_a_max)) ||
     ((t_to_v_min < vMin_local && (t_to_a_max < 0.0)))) {
    velocity_brake(this,a0_local,vMax_local,vMin_local,aMax_local,aMin_local,jMax_local,t_to_a_max);
  }
  else if (((v_at_a_zero < aMax_local) && (0.0 < t_to_a_max)) ||
          ((aMax_local < v_at_a_zero && (t_to_a_max < 0.0)))) {
    t_to_v_max = -(v_at_a_zero - aMax_local) / aMin_local;
    local_78 = -aMin_local / (t_to_a_max * 2.0) - (v_at_a_zero - vMin_local) / aMin_local;
    dVar3 = t_to_a_zero + 2.2e-14;
    pvVar1 = std::array<double,_2UL>::operator[](&this->t,0);
    *pvVar1 = dVar3;
    local_80 = local_78 - 2.2e-14;
    pdVar2 = std::min<double>(&t_to_v_max,&local_80);
    local_88 = 0.0;
    pdVar2 = std::max<double>(pdVar2,&local_88);
    dVar3 = *pdVar2;
    pvVar1 = std::array<double,_2UL>::operator[](&this->t,1);
    *pvVar1 = dVar3;
  }
  else {
    dVar3 = t_to_a_zero + 2.2e-14;
    pvVar1 = std::array<double,_2UL>::operator[](&this->t,0);
    *pvVar1 = dVar3;
  }
  return;
}

Assistant:

void BrakeProfile::acceleration_brake(double v0, double a0, double vMax, double vMin, double aMax, double aMin, double jMax) {
    j[0] = -jMax;

    const double t_to_a_max = (a0 - aMax) / jMax;
    const double t_to_a_zero = a0 / jMax;

    const double v_at_a_max = v_at_t(v0, a0, -jMax, t_to_a_max);
    const double v_at_a_zero = v_at_t(v0, a0, -jMax, t_to_a_zero);

    if ((v_at_a_zero > vMax && jMax > 0) || (v_at_a_zero < vMax && jMax < 0)) {
        velocity_brake(v0, a0, vMax, vMin, aMax, aMin, jMax);

    } else if ((v_at_a_max < vMin && jMax > 0) || (v_at_a_max > vMin && jMax < 0)) {
        const double t_to_v_min = -(v_at_a_max - vMin)/aMax;
        const double t_to_v_max = -aMax/(2*jMax) - (v_at_a_max - vMax)/aMax;

        t[0] = t_to_a_max + eps;
        t[1] = std::max(std::min(t_to_v_min, t_to_v_max - eps), 0.0);

    } else {
        t[0] = t_to_a_max + eps;
    }
}